

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int lj_opt_fwd_wasnonnil(jit_State *J,IROpT loadop,IRRef xref)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  IRIns *pIVar5;
  bool bVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  uint uVar8;
  uint in_R9D;
  ulong uVar9;
  
  uVar8 = (uint)J->chain[(CONCAT62(in_register_00000032,loadop) & 0xffffffff) + 7];
  do {
    if (uVar8 <= xref) {
      uVar3 = J->chain[loadop];
      while( true ) {
        if (uVar3 <= xref) {
          return 0;
        }
        pIVar5 = (J->cur).ir;
        uVar9 = (ulong)(uint)uVar3;
        if (pIVar5[uVar9].field_0.op1 == xref) break;
        uVar3 = *(ushort *)((long)pIVar5 + uVar9 * 8 + 6);
      }
      return (uint)((*(byte *)((long)pIVar5 + uVar9 * 8 + 4) & 0x1f) != 0);
    }
    pIVar5 = (J->cur).ir;
    uVar9 = (ulong)uVar8;
    bVar1 = *(byte *)((long)pIVar5 + uVar9 * 8 + 4);
    if (pIVar5[uVar9].field_0.op1 == xref) {
      uVar7 = (uint)((bVar1 & 0x1f) != 0);
LAB_0014cc0c:
      bVar6 = false;
      in_R9D = uVar7;
    }
    else {
      if ((bVar1 & 0x1f) == 0) {
        uVar3 = *(ushort *)((long)pIVar5 + (ulong)pIVar5[uVar9].field_0.op1 * 8 + 2);
        uVar4 = *(ushort *)((long)pIVar5 + (ulong)xref * 8 + 2);
        if (loadop == 0x41) {
LAB_0014cc6a:
          bVar6 = false;
          if (uVar3 == uVar4) {
            uVar7 = 0;
          }
          else {
            uVar7 = 0;
            if (-1 < (short)(uVar3 | uVar4)) goto LAB_0014cc80;
          }
        }
        else {
          bVar1 = *(byte *)((long)pIVar5 + (ulong)uVar3 * 8 + 4);
          bVar2 = *(byte *)((long)pIVar5 + (ulong)uVar4 * 8 + 4);
          if (((bVar2 ^ bVar1) & 0x1f) == 0) goto LAB_0014cc6a;
          bVar6 = false;
          uVar7 = 0;
          if (((bVar1 & 0x1f) == 5) != ((bVar2 & 0x1f) != 5)) {
LAB_0014cc80:
            bVar6 = true;
            uVar7 = in_R9D;
          }
        }
        in_R9D = uVar7;
        if (!bVar6) goto LAB_0014cc0c;
      }
      uVar8 = (uint)*(ushort *)((long)pIVar5 + uVar9 * 8 + 6);
      bVar6 = true;
    }
    if (!bVar6) {
      return in_R9D;
    }
  } while( true );
}

Assistant:

int lj_opt_fwd_wasnonnil(jit_State *J, IROpT loadop, IRRef xref)
{
  /* First check stores. */
  IRRef ref = J->chain[loadop+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    if (store->op1 == xref) {  /* Same xREF. */
      /* A nil store MAY alias, but a non-nil store MUST alias. */
      return !irt_isnil(store->t);
    } else if (irt_isnil(store->t)) {  /* Must check any nil store. */
      IRRef skref = IR(store->op1)->op2;
      IRRef xkref = IR(xref)->op2;
      /* Same key type MAY alias. Need ALOAD check due to multiple int types. */
      if (loadop == IR_ALOAD || irt_sametype(IR(skref)->t, IR(xkref)->t)) {
	if (skref == xkref || !irref_isk(skref) || !irref_isk(xkref))
	  return 0;  /* A nil store with same const key or var key MAY alias. */
	/* Different const keys CANNOT alias. */
      } else if (irt_isp32(IR(skref)->t) != irt_isp32(IR(xkref)->t)) {
	return 0;  /* HREF and HREFK MAY alias. */
      }  /* Different key types CANNOT alias. */
    }  /* Other non-nil stores MAY alias. */
    ref = store->prev;
  }

  /* Check loads since nothing could be derived from stores. */
  ref = J->chain[loadop];
  while (ref > xref) {
    IRIns *load = IR(ref);
    if (load->op1 == xref) {  /* Same xREF. */
      /* A nil load MAY alias, but a non-nil load MUST alias. */
      return !irt_isnil(load->t);
    }  /* Other non-nil loads MAY alias. */
    ref = load->prev;
  }
  return 0;  /* Nothing derived at all, previous value MAY be nil. */
}